

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O2

void __thiscall
scApp::scApp(scApp *this,string *version,string *defaultVersion,commandOptions *options)

{
  option my_option_list [31];
  
  ktxApp::ktxApp(&this->super_ktxApp,version,defaultVersion,&options->super_commandOptions);
  (this->super_ktxApp)._vptr_ktxApp = (_func_int **)&PTR___cxa_pure_virtual_001259c8;
  this->options = options;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->scparamKey,"KTXwriterScParams",(allocator<char> *)my_option_list);
  (this->scparams)._M_dataplus._M_p = (pointer)&(this->scparams).field_2;
  (this->scparams)._M_string_length = 0;
  (this->scparams).field_2._M_local_buf[0] = '\0';
  my_option_list[0].name = "zcmp";
  my_option_list[0].has_arg = optional_argument;
  my_option_list[0].flag = (int *)0x0;
  my_option_list[0].val = 0x7a;
  my_option_list[1].name = "no_multithreading";
  my_option_list[1].has_arg = no_argument;
  my_option_list[1].flag = (int *)0x0;
  my_option_list[1].val = 0x4e;
  my_option_list[2].name = "threads";
  my_option_list[2].has_arg = required_argument;
  my_option_list[2].flag = (int *)0x0;
  my_option_list[2].val = 0x74;
  my_option_list[3].name = "clevel";
  my_option_list[3].flag = (int *)0x0;
  my_option_list[3].val = 99;
  my_option_list[4].name = "qlevel";
  my_option_list[4].flag = (int *)0x0;
  my_option_list[4].val = 0x71;
  my_option_list[5].name = "max_endpoints";
  my_option_list[5].flag = (int *)0x0;
  my_option_list[5].val = 0x65;
  my_option_list[6].name = "endpoint_rdo_threshold";
  my_option_list[6].flag = (int *)0x0;
  my_option_list[6].val = 0x45;
  my_option_list[7].name = "max_selectors";
  my_option_list[7].flag = (int *)0x0;
  my_option_list[7].val = 0x75;
  my_option_list[8].name = "selector_rdo_threshold";
  my_option_list[8].flag = (int *)0x0;
  my_option_list[8].val = 0x53;
  my_option_list[9].name = "normal_mode";
  my_option_list[9].has_arg = no_argument;
  my_option_list[9].flag = (int *)0x0;
  my_option_list[9].val = 0x6e;
  my_option_list[10].name = "separate_rg_to_color_alpha";
  my_option_list[10].has_arg = no_argument;
  my_option_list[10].flag = (int *)0x0;
  my_option_list[10].val = 1000;
  my_option_list[0xb].name = "no_endpoint_rdo";
  my_option_list[0xb].has_arg = no_argument;
  my_option_list[0xb].flag = (int *)0x0;
  my_option_list[0xb].val = 0x3e9;
  my_option_list[0xc].name = "no_selector_rdo";
  my_option_list[0xc].has_arg = no_argument;
  my_option_list[0xc].flag = (int *)0x0;
  my_option_list[0xc].val = 0x3ea;
  my_option_list[0xd].name = "no_sse";
  my_option_list[0xd].has_arg = no_argument;
  my_option_list[0xd].flag = (int *)0x0;
  my_option_list[0xd].val = 0x3f3;
  my_option_list[0xe].name = "uastc_quality";
  my_option_list[0xe].flag = (int *)0x0;
  my_option_list[0xe].val = 0x3eb;
  my_option_list[0xf].name = "uastc_rdo_l";
  my_option_list[0xf].flag = (int *)0x0;
  my_option_list[0xf].val = 0x3ec;
  my_option_list[0x10].name = "uastc_rdo_d";
  my_option_list[0x10].flag = (int *)0x0;
  my_option_list[0x10].val = 0x3ed;
  my_option_list[0x11].name = "uastc_rdo_b";
  my_option_list[0x11].flag = (int *)0x0;
  my_option_list[0x11].val = 0x3ee;
  my_option_list[0x12].name = "uastc_rdo_s";
  my_option_list[0x12].flag = (int *)0x0;
  my_option_list[0x12].val = 0x3ef;
  my_option_list[0x13].name = "uastc_rdo_f";
  my_option_list[0x13].has_arg = no_argument;
  my_option_list[0x13].flag = (int *)0x0;
  my_option_list[0x13].val = 0x3f0;
  my_option_list[0x14].name = "uastc_rdo_m";
  my_option_list[0x14].has_arg = no_argument;
  my_option_list[0x14].flag = (int *)0x0;
  my_option_list[0x14].val = 0x3f1;
  my_option_list[0x15].name = "verbose";
  my_option_list[0x15].has_arg = no_argument;
  my_option_list[0x15].flag = (int *)0x0;
  my_option_list[0x15].val = 0x3f2;
  my_option_list[0x16].name = "astc_blk_d";
  my_option_list[0x16].flag = (int *)0x0;
  my_option_list[0x16].val = 0x3f4;
  my_option_list[0x17].name = "astc_mode";
  my_option_list[0x17].flag = (int *)0x0;
  my_option_list[0x17].val = 0x3f5;
  my_option_list[0x18].name = "astc_quality";
  my_option_list[0x18].flag = (int *)0x0;
  my_option_list[0x18].val = 0x3f6;
  my_option_list[0x19].name = "astc_perceptual";
  my_option_list[0x19].has_arg = no_argument;
  my_option_list[0x19].flag = (int *)0x0;
  my_option_list[0x19].val = 0x3f7;
  my_option_list[0x1a].name = "encode";
  my_option_list[0x1a].flag = (int *)0x0;
  my_option_list[0x1a].val = 0x3f8;
  my_option_list[0x1b].name = "input_swizzle";
  my_option_list[0x1b].flag = (int *)0x0;
  my_option_list[0x1b].val = 0x44c;
  my_option_list[0x1c].name = "normalize";
  my_option_list[0x1c].has_arg = no_argument;
  my_option_list[0x1c].flag = (int *)0x0;
  my_option_list[0x1c].val = 0x3f9;
  my_option_list[0x1d].name = "bcmp";
  my_option_list[0x1d].has_arg = no_argument;
  my_option_list[0x1d].flag = (int *)0x0;
  my_option_list[0x1d].val = 0x62;
  my_option_list[0x1e].name = "uastc";
  my_option_list[0x1e].flag = (int *)0x0;
  my_option_list[0x1e].val = 0x3fa;
  my_option_list[3].has_arg = my_option_list[2].has_arg;
  my_option_list[4].has_arg = my_option_list[2].has_arg;
  my_option_list[5].has_arg = my_option_list[2].has_arg;
  my_option_list[6].has_arg = my_option_list[2].has_arg;
  my_option_list[7].has_arg = my_option_list[2].has_arg;
  my_option_list[8].has_arg = my_option_list[2].has_arg;
  my_option_list[0xe].has_arg = my_option_list[2].has_arg;
  my_option_list[0xf].has_arg = my_option_list[0].has_arg;
  my_option_list[0x10].has_arg = my_option_list[2].has_arg;
  my_option_list[0x11].has_arg = my_option_list[0].has_arg;
  my_option_list[0x12].has_arg = my_option_list[0].has_arg;
  my_option_list[0x16].has_arg = my_option_list[2].has_arg;
  my_option_list[0x17].has_arg = my_option_list[2].has_arg;
  my_option_list[0x18].has_arg = my_option_list[2].has_arg;
  my_option_list[0x1a].has_arg = my_option_list[2].has_arg;
  my_option_list[0x1b].has_arg = my_option_list[2].has_arg;
  my_option_list[0x1e].has_arg = my_option_list[0].has_arg;
  std::vector<argparser::option,std::allocator<argparser::option>>::insert<argparser::option*,void>
            ((vector<argparser::option,std::allocator<argparser::option>> *)
             &(this->super_ktxApp).option_list,
             (this->super_ktxApp).option_list.
             super__Vector_base<argparser::option,_std::allocator<argparser::option>_>._M_impl.
             super__Vector_impl_data._M_start,my_option_list,(option *)&stack0xffffffffffffffe8);
  std::__cxx11::string::append((char *)&(this->super_ktxApp).short_opts);
  return;
}

Assistant:

scApp::scApp(string& version, string& defaultVersion,
             scApp::commandOptions& options)
      : ktxApp(version, defaultVersion, options), options(options)
{
  argparser::option my_option_list[] = {
      { "zcmp", argparser::option::optional_argument, NULL, 'z' },
      { "no_multithreading", argparser::option::no_argument, NULL, 'N' },
      { "threads", argparser::option::required_argument, NULL, 't' },
      { "clevel", argparser::option::required_argument, NULL, 'c' },
      { "qlevel", argparser::option::required_argument, NULL, 'q' },
      { "max_endpoints", argparser::option::required_argument, NULL, 'e' },
      { "endpoint_rdo_threshold", argparser::option::required_argument, NULL, 'E' },
      { "max_selectors", argparser::option::required_argument, NULL, 'u' },
      { "selector_rdo_threshold", argparser::option::required_argument, NULL, 'S' },
      { "normal_mode", argparser::option::no_argument, NULL, 'n' },
      { "separate_rg_to_color_alpha", argparser::option::no_argument, NULL, 1000 },
      { "no_endpoint_rdo", argparser::option::no_argument, NULL, 1001 },
      { "no_selector_rdo", argparser::option::no_argument, NULL, 1002 },
      { "no_sse", argparser::option::no_argument, NULL, 1011 },
      { "uastc_quality", argparser::option::required_argument, NULL, 1003 },
      { "uastc_rdo_l", argparser::option::optional_argument, NULL, 1004 },
      { "uastc_rdo_d", argparser::option::required_argument, NULL, 1005 },
      { "uastc_rdo_b", argparser::option::optional_argument, NULL, 1006 },
      { "uastc_rdo_s", argparser::option::optional_argument, NULL, 1007 },
      { "uastc_rdo_f", argparser::option::no_argument, NULL, 1008 },
      { "uastc_rdo_m", argparser::option::no_argument, NULL, 1009 },
      { "verbose", argparser::option::no_argument, NULL, 1010 },
      { "astc_blk_d", argparser::option::required_argument, NULL, 1012 },
      { "astc_mode", argparser::option::required_argument, NULL, 1013 },
      { "astc_quality", argparser::option::required_argument, NULL, 1014 },
      { "astc_perceptual", argparser::option::no_argument, NULL, 1015 },
      { "encode", argparser::option::required_argument, NULL, 1016 },
      { "input_swizzle", argparser::option::required_argument, NULL, 1100},
      { "normalize", argparser::option::no_argument, NULL, 1017 },
      // Deprecated options
      { "bcmp", argparser::option::no_argument, NULL, 'b' },
      { "uastc", argparser::option::optional_argument, NULL, 1018 }
  };
  const int lastOptionIndex = sizeof(my_option_list)
                              / sizeof(argparser::option);
  option_list.insert(option_list.begin(), my_option_list,
                     my_option_list + lastOptionIndex);
  short_opts += "z;Nt:c:q:e:E:u:S:nb";
}